

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O0

char * path_direction(wchar_t feat)

{
  char *pcStack_10;
  wchar_t feat_local;
  
  if (feat == FEAT_LESS_NORTH) {
    pcStack_10 = "north";
  }
  else if (feat == FEAT_MORE_NORTH) {
    pcStack_10 = "north";
  }
  else if (feat == FEAT_LESS_EAST) {
    pcStack_10 = "east";
  }
  else if (feat == FEAT_MORE_EAST) {
    pcStack_10 = "east";
  }
  else if (feat == FEAT_LESS_SOUTH) {
    pcStack_10 = "south";
  }
  else if (feat == FEAT_MORE_SOUTH) {
    pcStack_10 = "south";
  }
  else if (feat == FEAT_LESS_WEST) {
    pcStack_10 = "west";
  }
  else if (feat == FEAT_MORE_WEST) {
    pcStack_10 = "west";
  }
  else if (feat == FEAT_LESS) {
    pcStack_10 = "up";
  }
  else if (feat == FEAT_MORE) {
    pcStack_10 = "down";
  }
  else {
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

static const char *path_direction(int feat)
{
	if (feat == FEAT_LESS_NORTH) return "north";
	if (feat == FEAT_MORE_NORTH) return "north";
	if (feat == FEAT_LESS_EAST) return "east";
	if (feat == FEAT_MORE_EAST) return "east";
	if (feat == FEAT_LESS_SOUTH) return "south";
	if (feat == FEAT_MORE_SOUTH) return "south";
	if (feat == FEAT_LESS_WEST) return "west";
	if (feat == FEAT_MORE_WEST) return "west";
	if (feat == FEAT_LESS) return "up";
	if (feat == FEAT_MORE) return "down";
	return "";
}